

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# symbol.cpp
# Opt level: O2

Symbol * sym_AddVar(char *symName,int32_t value)

{
  SymbolType SVar1;
  Symbol *sym;
  char *pcVar2;
  
  sym = sym_FindExactSymbol(symName);
  if (sym == (Symbol *)0x0) {
    sym = createsymbol(symName);
  }
  else {
    SVar1 = sym->type;
    if ((SVar1 != SYM_VAR) && (SVar1 != SYM_REF)) {
      pcVar2 = "constant";
      if (SVar1 == SYM_LABEL) {
        pcVar2 = "label";
      }
      error("\'%s\' already defined as %s at ",symName,pcVar2);
      dumpFilename(sym);
      putc(10,_stderr);
      return sym;
    }
    updateSymbolFilename(sym);
  }
  sym->type = SYM_VAR;
  (sym->field_8).value = value;
  return sym;
}

Assistant:

struct Symbol *sym_AddVar(char const *symName, int32_t value)
{
	struct Symbol *sym = sym_FindExactSymbol(symName);

	if (!sym) {
		sym = createsymbol(symName);
	} else if (sym_IsDefined(sym) && sym->type != SYM_VAR) {
		error("'%s' already defined as %s at ",
		      symName, sym->type == SYM_LABEL ? "label" : "constant");
		dumpFilename(sym);
		putc('\n', stderr);
		return sym;
	} else {
		updateSymbolFilename(sym);
	}

	sym->type = SYM_VAR;
	sym->value = value;

	return sym;
}